

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode output_auth_headers(Curl_easy *data,connectdata *conn,auth *authstatus,char *request,
                            char *path,_Bool proxy)

{
  unsigned_long uVar1;
  CURLcode CVar2;
  char *pcVar3;
  size_t insize;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *authorization;
  size_t size;
  char *local_48;
  long local_40;
  size_t local_38;
  
  uVar1 = authstatus->picked;
  pcVar7 = (char *)0x0;
  if (7 < (long)uVar1) {
    if (uVar1 == 8) {
      CVar2 = Curl_output_ntlm(data,proxy);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      pcVar7 = "NTLM";
    }
    else if (uVar1 == 0x80) {
      CVar2 = Curl_output_aws_sigv4(data,proxy);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      pcVar7 = "AWS_SIGV4";
    }
    goto LAB_0013aa81;
  }
  if (uVar1 != 1) {
    if (uVar1 == 2) {
      CVar2 = Curl_output_digest(data,proxy,(uchar *)request,(uchar *)path);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      pcVar7 = "Digest";
    }
    goto LAB_0013aa81;
  }
  if (proxy) {
    if ((((uint)conn->bits & 4) == 0) ||
       (pcVar7 = Curl_checkProxyheaders(data,conn,"Proxy-authorization",0x13), pcVar7 != (char *)0x0
       )) {
      if (!proxy) goto LAB_0013aa32;
      goto LAB_0013aa59;
    }
LAB_0013ab84:
    local_38 = 0;
    lVar6 = 0x12f0;
    if (proxy) {
      lVar6 = 0x12d8;
    }
    local_48 = (char *)0x0;
    pcVar7 = (&(data->state).aptr.user)[(ulong)proxy * 2];
    pcVar3 = "";
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    pcVar4 = *(char **)((data->info).conn_primary_ip + (ulong)proxy * 0x10 + -0x7c);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "";
    }
    pcVar7 = curl_maprintf("%s:%s",pcVar7,pcVar4);
    if (pcVar7 == (char *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    else {
      local_40 = lVar6;
      insize = strlen(pcVar7);
      CVar2 = Curl_base64_encode(pcVar7,insize,&local_48,&local_38);
      lVar6 = local_40;
      if (CVar2 == CURLE_OK) {
        if (local_48 == (char *)0x0) {
          CVar2 = CURLE_REMOTE_ACCESS_DENIED;
        }
        else {
          (*Curl_cfree)(*(void **)((long)&data->magic + local_40));
          if (proxy) {
            pcVar3 = "Proxy-";
          }
          pcVar3 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar3,local_48);
          *(char **)((long)&data->magic + lVar6) = pcVar3;
          (*Curl_cfree)(local_48);
          CVar2 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)&data->magic + lVar6) != 0) {
            CVar2 = CURLE_OK;
          }
        }
      }
      (*Curl_cfree)(pcVar7);
    }
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar7 = "Basic";
  }
  else {
LAB_0013aa32:
    if (((data->state).aptr.user != (char *)0x0) &&
       (pcVar7 = Curl_checkheaders(data,"Authorization",0xd), pcVar7 == (char *)0x0))
    goto LAB_0013ab84;
LAB_0013aa59:
    pcVar7 = (char *)0x0;
  }
  authstatus->field_0x18 = authstatus->field_0x18 | 1;
LAB_0013aa81:
  if (authstatus->picked == 0x40) {
    if (((!proxy) && ((data->set).str[0x40] != (char *)0x0)) &&
       (pcVar3 = Curl_checkheaders(data,"Authorization",0xd), pcVar3 == (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.userpwd);
      pcVar7 = curl_maprintf("Authorization: Bearer %s\r\n",(data->set).str[0x40]);
      (data->state).aptr.userpwd = pcVar7;
      if (pcVar7 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar7 = "Bearer";
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  if (pcVar7 == (char *)0x0) {
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
  }
  else {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      pcVar3 = "Server";
      if (proxy) {
        pcVar3 = "Proxy";
      }
      pcVar4 = (&(data->state).aptr.user)[(ulong)proxy * 2];
      pcVar5 = "";
      if (pcVar4 != (char *)0x0) {
        pcVar5 = pcVar4;
      }
      Curl_infof(data,"%s auth using %s with user \'%s\'",pcVar3,pcVar7,pcVar5);
    }
    authstatus->field_0x18 =
         (authstatus->field_0x18 & 0xfd | authstatus->field_0x18 * '\x02' & 2U) ^ 2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct Curl_easy *data,
                    struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
  (void)conn;

#ifdef CURL_DISABLE_DIGEST_AUTH
  (void)request;
  (void)path;
#endif
#ifndef CURL_DISABLE_AWS
  if(authstatus->picked == CURLAUTH_AWS_SIGV4) {
    auth = "AWS_SIGV4";
    result = Curl_output_aws_sigv4(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_SPNEGO
  if(authstatus->picked == CURLAUTH_NEGOTIATE) {
    auth = "Negotiate";
    result = Curl_output_negotiate(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(data,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_BASIC_AUTH
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if(
#ifndef CURL_DISABLE_PROXY
      (proxy && conn->bits.proxy_user_passwd &&
       !Curl_checkProxyheaders(data, conn, STRCONST("Proxy-authorization"))) ||
#endif
      (!proxy && data->state.aptr.user &&
       !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Basic";
      result = http_output_basic(data, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif
#ifndef CURL_DISABLE_BEARER_AUTH
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && data->set.str[STRING_BEARER] &&
        !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Bearer";
      result = http_output_bearer(data);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif

  if(auth) {
#ifndef CURL_DISABLE_PROXY
    infof(data, "%s auth using %s with user '%s'",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (data->state.aptr.proxyuser ?
                   data->state.aptr.proxyuser : "") :
          (data->state.aptr.user ?
           data->state.aptr.user : ""));
#else
    (void)proxy;
    infof(data, "Server auth using %s with user '%s'",
          auth, data->state.aptr.user ?
          data->state.aptr.user : "");
#endif
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return result;
}